

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn.cpp
# Opt level: O0

int __thiscall ncnn::LRN::forward_inplace(LRN *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar4;
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_4;
  Mat m;
  float *ptr_2;
  int q_2;
  int j;
  int i_3;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  int i_2;
  Allocator *in_stack_000001e8;
  int in_stack_000001f0;
  float *ptr_1;
  int i_1;
  float *sptr;
  int p;
  float *ssptr;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffbc0;
  int _c;
  undefined4 in_stack_fffffffffffffbc8;
  float in_stack_fffffffffffffbcc;
  float in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  size_type in_stack_fffffffffffffbd8;
  Mat *in_stack_fffffffffffffbe0;
  int local_3a0;
  float local_39c;
  int local_390;
  int local_38c;
  Mat local_388;
  Mat local_348;
  float *local_308;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  reference local_2e8;
  vector<int,_std::allocator<int>_> local_2d8;
  float local_2bc;
  int local_2b8;
  int local_2b4;
  Mat local_2b0;
  int local_26c;
  int local_268;
  int local_264;
  Mat local_260;
  float *local_220;
  int local_214;
  Mat local_210;
  float *local_1d0;
  int local_1c4;
  Mat local_1c0;
  float *local_180;
  int local_178;
  float local_174;
  Mat local_170;
  int local_12c;
  Mat local_128;
  float *local_e8;
  Mat local_e0;
  float *local_a0;
  int local_94;
  int local_90;
  Mat local_80;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  int local_4;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x34);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_24 * local_28;
  local_20 = in_RDX;
  Mat::Mat(&local_80);
  Mat::create(in_stack_fffffffffffffbe0,(int)(in_stack_fffffffffffffbd8 >> 0x20),
              (int)in_stack_fffffffffffffbd8,(int)in_stack_fffffffffffffbd4,
              CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
              (Allocator *)in_stack_fffffffffffffbc0);
  bVar2 = Mat::empty(in_stack_fffffffffffffbc0);
  if (bVar2) {
    local_4 = -100;
    local_90 = 1;
    goto LAB_00161fe8;
  }
  for (local_94 = 0; local_94 < local_2c; local_94 = local_94 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_e0);
    Mat::~Mat((Mat *)0x161416);
    local_a0 = pfVar3;
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                 (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
    pfVar3 = Mat::operator_cast_to_float_(&local_128);
    Mat::~Mat((Mat *)0x161465);
    for (local_12c = 0; local_12c < local_3c; local_12c = local_12c + 1) {
      pfVar3[local_12c] = local_a0[local_12c] * local_a0[local_12c];
    }
    local_e8 = pfVar3;
  }
  if (*(int *)(in_RDI + 0x80) == 0) {
    Mat::Mat(&local_170);
    Mat::create(in_stack_fffffffffffffbe0,(int)(in_stack_fffffffffffffbd8 >> 0x20),
                (int)in_stack_fffffffffffffbd8,(int)in_stack_fffffffffffffbd4,
                CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                (Allocator *)in_stack_fffffffffffffbc0);
    bVar2 = Mat::empty(in_stack_fffffffffffffbc0);
    if (bVar2) {
      local_4 = -100;
      local_90 = 1;
    }
    else {
      Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                in_stack_fffffffffffffbcc);
      local_174 = *(float *)(in_RDI + 0x88) / (float)*(int *)(in_RDI + 0x84);
      for (local_178 = 0; local_178 < local_2c; local_178 = local_178 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_1c0);
        Mat::~Mat((Mat *)0x161689);
        local_180 = pfVar3;
        for (local_1c4 = local_178 - *(int *)(in_RDI + 0x84) / 2;
            _c = (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
            local_1c4 <= local_178 + *(int *)(in_RDI + 0x84) / 2; local_1c4 = local_1c4 + 1) {
          if ((-1 < local_1c4) && (local_1c4 < local_2c)) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),_c);
            pfVar3 = Mat::operator_cast_to_float_(&local_210);
            Mat::~Mat((Mat *)0x161782);
            for (local_214 = 0; local_1d0 = pfVar3, local_214 < local_3c; local_214 = local_214 + 1)
            {
              local_180[local_214] = pfVar3[local_214] + local_180[local_214];
            }
          }
        }
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),_c);
        pfVar3 = Mat::operator_cast_to_float_(&local_260);
        Mat::~Mat((Mat *)0x161869);
        local_220 = pfVar3;
        for (local_264 = 0; local_264 < local_3c; local_264 = local_264 + 1) {
          fVar1 = local_220[local_264];
          dVar4 = std::pow((double)(ulong)(uint)(*(float *)(in_RDI + 0x90) +
                                                local_174 * local_180[local_264]),
                           (double)((ulong)*(uint *)(in_RDI + 0x8c) ^ 0x8000000080000000));
          local_220[local_264] = fVar1 * SUB84(dVar4,0);
        }
      }
      local_90 = 0;
    }
    Mat::~Mat((Mat *)0x16198c);
joined_r0x00161fae:
    if (local_90 != 0) goto LAB_00161fe8;
  }
  else if (*(int *)(in_RDI + 0x80) == 1) {
    local_268 = local_24;
    local_26c = local_28;
    Mat::Mat(&local_2b0,&local_80);
    local_2b4 = *(int *)(in_RDI + 0x84) / 2;
    if (local_2b4 < 1) {
LAB_00161af2:
      local_2b8 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x84);
      local_2bc = *(float *)(in_RDI + 0x88) / (float)local_2b8;
      std::allocator<int>::allocator((allocator<int> *)0x161b47);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbe0,
                 in_stack_fffffffffffffbd8,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      std::allocator<int>::~allocator((allocator<int> *)0x161b6d);
      local_2e8 = std::vector<int,_std::allocator<int>_>::operator[](&local_2d8,0);
      local_2ec = 0;
      local_2f0 = 0;
      local_2f4 = local_24 - *(int *)(in_RDI + 0x84);
      for (local_2f8 = 0; local_2f8 < *(int *)(in_RDI + 0x84); local_2f8 = local_2f8 + 1) {
        for (local_2fc = 0; local_2fc < *(int *)(in_RDI + 0x84); local_2fc = local_2fc + 1) {
          local_2e8[local_2ec] = local_2f0;
          local_2ec = local_2ec + 1;
          local_2f0 = local_2f0 + 1;
        }
        local_2f0 = local_2f4 + local_2f0;
      }
      for (local_300 = 0; local_300 < local_2c; local_300 = local_300 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_348);
        Mat::~Mat((Mat *)0x161cfe);
        local_308 = pfVar3;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                     (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20));
        for (local_38c = 0; local_38c < local_26c; local_38c = local_38c + 1) {
          for (local_390 = 0; local_390 < local_268; local_390 = local_390 + 1) {
            pfVar3 = Mat::row(&local_388,local_38c);
            local_39c = 0.0;
            for (local_3a0 = 0; local_3a0 < local_2b8; local_3a0 = local_3a0 + 1) {
              local_39c = pfVar3[(long)local_390 + (long)local_2e8[local_3a0]] + local_39c;
            }
            in_stack_fffffffffffffbd0 = local_308[local_390];
            dVar4 = std::pow((double)(ulong)(uint)(*(float *)(in_RDI + 0x90) + local_2bc * local_39c
                                                  ),
                             (double)((ulong)*(uint *)(in_RDI + 0x8c) ^ 0x8000000080000000));
            in_stack_fffffffffffffbd4 = SUB84(dVar4,0);
            local_308[local_390] = in_stack_fffffffffffffbd0 * in_stack_fffffffffffffbd4;
          }
          local_308 = local_308 + local_268;
        }
        Mat::~Mat((Mat *)0x161f6a);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      local_90 = 0;
    }
    else {
      in_stack_fffffffffffffbc0 = *(Mat **)(local_20 + 0x10);
      in_stack_fffffffffffffbc8 = *(undefined4 *)(local_20 + 4);
      copy_make_border((Mat *)square_blob_bordered.cstep,(Mat *)square_blob_bordered._48_8_,
                       square_blob_bordered.w,square_blob_bordered.dims,
                       square_blob_bordered.allocator._4_4_,(int)square_blob_bordered.allocator,outw
                       ,(float)square_blob_bordered._28_4_,in_stack_000001e8,in_stack_000001f0);
      bVar2 = Mat::empty(in_stack_fffffffffffffbc0);
      if (!bVar2) {
        local_24 = local_2b0.w;
        local_28 = local_2b0.h;
        goto LAB_00161af2;
      }
      local_4 = -100;
      local_90 = 1;
    }
    Mat::~Mat((Mat *)0x161fa5);
    goto joined_r0x00161fae;
  }
  local_4 = 0;
  local_90 = 1;
LAB_00161fe8:
  Mat::~Mat((Mat *)0x161ff5);
  return local_4;
}

Assistant:

int LRN::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i] * ptr[i];
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            // square sum
            float* ssptr = square_sum.channel(q);
            for (int p=q - local_size / 2; p<=q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                for (int i=0; i<size; i++)
                {
                    ssptr[i] += sptr[i];
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * pow(bias + alpha_div_size * ssptr[i], -beta);
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}